

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O0

void amrex::Sleep(double sleepsec)

{
  duration<double,_std::ratio<1L,_1L>_> *in_stack_00000020;
  duration<double,std::ratio<1l,1l>> local_10 [8];
  double local_8;
  
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<double,void>(local_10,&local_8);
  std::this_thread::sleep_for<double,std::ratio<1l,1l>>(in_stack_00000020);
  return;
}

Assistant:

void amrex::Sleep(double sleepsec) {
    std::this_thread::sleep_for(std::chrono::duration<double>(sleepsec));
}